

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O2

int floatx80_eq_quiet_aarch64(floatx80 a,floatx80 b,float_status *status)

{
  ushort uVar1;
  uint uVar2;
  uint64_t uVar3;
  ushort uVar4;
  
  uVar3 = a.low;
  uVar1 = a.high;
  if ((long)uVar3 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar4 = b.high & 0x7fff;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)b.low < 0
       ) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
           (uVar1 & 0x7fff) != 0x7fff) &&
         (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
          uVar4 != 0x7fff)) {
        uVar2 = 0;
        if (uVar3 == b.low) {
          if (uVar1 == b.high) {
            return 1;
          }
          if (uVar3 == 0) {
            uVar2 = (uint)(((b._8_4_ | a._8_4_) & 0x7fff) == 0);
          }
        }
      }
      else if ((((uVar1 & 0x7fff) == 0x7fff) &&
               ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) !=
                 (undefined1  [16])0x0 &&
                (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) ==
                 (undefined1  [16])0x0)))) ||
              ((uVar2 = 0, uVar4 == 0x7fff &&
               ((((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                 (undefined1  [16])0x0 &&
                (((undefined1  [16])b & (undefined1  [16])0x4000000000000000) ==
                 (undefined1  [16])0x0)))))) goto LAB_005852b9;
      return uVar2;
    }
  }
LAB_005852b9:
  status->float_exception_flags = status->float_exception_flags | 1;
  return 0;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}